

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>::TestBody
          (ParticleArrayTest_Back_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)2>_>_>
           *this)

{
  double *pdVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  PositionType minPosition;
  PositionType maxPosition;
  AssertionResult gtest_ar__1;
  ParticleArray particlesCopy;
  ParticleArray particles;
  ParticleType particle;
  AssertionResult local_d8;
  AssertHelper local_c8;
  AssertionResult local_c0;
  long local_b0;
  vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  local_a8;
  long *local_88 [2];
  Particle local_78;
  AssertHelper local_38;
  
  local_a8.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Particle<(pica::Dimension)2> *)0x0;
  local_a8.
  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Particle<(pica::Dimension)2> *)0x0;
  iVar5 = 0xd;
  do {
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)2>_>::randomParticle
              (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)2>_> *)this,
               minPosition,maxPosition);
    if (local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<pica::Particle<(pica::Dimension)2>,std::allocator<pica::Particle<(pica::Dimension)2>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)2>const&>
                ((vector<pica::Particle<(pica::Dimension)2>,std::allocator<pica::Particle<(pica::Dimension)2>>>
                  *)&local_a8,
                 (iterator)
                 local_a8.
                 super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_78);
    }
    else {
      (local_a8.
       super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->invGamma = local_78.invGamma;
      *(ulong *)&(local_a8.
                  super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)->typeIndex =
           CONCAT62(local_78._58_6_,local_78.typeIndex);
      ((local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).z = local_78.p.z;
      (local_a8.
       super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->factor = local_78.factor;
      ((local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).x = local_78.p.x;
      ((local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).y = local_78.p.y;
      ((local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->position).x = local_78.position.x;
      ((local_a8.
        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->position).y = local_78.position.y;
      local_a8.
      super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a8.
           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    if ((((local_78.position.x !=
           local_a8.
           super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].position.x) ||
         (NAN(local_78.position.x) ||
          NAN(local_a8.
              super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].position.x))) ||
        (pdVar1 = &local_a8.
                   super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].position.y,
        local_78.position.y != *pdVar1)) || (NAN(local_78.position.y) || NAN(*pdVar1))) {
LAB_0019d108:
      local_c0.success_ = false;
LAB_0019d116:
      local_c0.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)local_88);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_d8,&local_c0,"this->eqParticles_(particle, particles.back())",
                 "false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x67,(char *)CONCAT71(local_d8._1_7_,local_d8.success_));
      testing::internal::AssertHelper::operator=(&local_c8,(Message *)local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_c8);
      if ((void *)CONCAT71(local_d8._1_7_,local_d8.success_) != (void *)0x0) {
        operator_delete__((void *)CONCAT71(local_d8._1_7_,local_d8.success_));
      }
      if (((local_88[0] != (long *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_88[0] != (long *)0x0)) {
        (**(code **)(*local_88[0] + 8))();
      }
    }
    else {
      dVar6 = *(double *)(pica::ParticleTypes::types + (long)local_78.typeIndex * 0x10);
      lVar4 = (long)local_a8.
                    super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].typeIndex * 0x10;
      dVar7 = *(double *)(pica::ParticleTypes::types + lVar4);
      if ((((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) ||
          ((dVar8 = local_78.p.x * 29979245800.0 * dVar6,
           dVar9 = local_a8.
                   super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].p.x * 29979245800.0 * dVar7,
           dVar8 != dVar9 ||
           ((NAN(dVar8) || NAN(dVar9) ||
            (dVar8 = local_78.p.y * 29979245800.0 * dVar6,
            dVar9 = local_a8.
                    super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].p.y * 29979245800.0 * dVar7,
            dVar8 != dVar9)))))) ||
         (((NAN(dVar8) || NAN(dVar9) ||
           (((dVar6 = local_78.p.z * 29979245800.0 * dVar6,
             dVar7 = local_a8.
                     super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].p.z * 29979245800.0 * dVar7,
             dVar6 != dVar7 || (NAN(dVar6) || NAN(dVar7))) ||
            (dVar6 = *(double *)(pica::ParticleTypes::types + 8 + (long)local_78.typeIndex * 0x10),
            pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar4), dVar6 != *pdVar1)))) ||
          (NAN(dVar6) || NAN(*pdVar1))))) goto LAB_0019d108;
      dVar6 = local_a8.
              super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].factor;
      local_c0.success_ = local_78.factor == dVar6;
      local_c0.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_78.factor != dVar6) || (NAN(local_78.factor) || NAN(dVar6))) goto LAB_0019d116;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_c0.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::
    vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
    ::vector((vector<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
              *)&local_c0,&local_a8);
    if ((((local_78.position.x != (double)local_c0.message_.ptr_[-2]._M_dataplus._M_p) ||
         (NAN(local_78.position.x) || NAN((double)local_c0.message_.ptr_[-2]._M_dataplus._M_p))) ||
        (local_78.position.y != (double)local_c0.message_.ptr_[-2]._M_string_length)) ||
       (NAN(local_78.position.y) || NAN((double)local_c0.message_.ptr_[-2]._M_string_length))) {
LAB_0019d2f0:
      local_d8.success_ = false;
LAB_0019d2fd:
      local_d8.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)local_88,&local_d8,"this->eqParticles_(particle, particlesCopy.back())"
                 ,"false","true");
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
                 ,0x69,(char *)local_88[0]);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_88[0] != (long *)0x0) {
        operator_delete__(local_88[0]);
      }
      if (((local_c8.data_ != (AssertHelperData *)0x0) &&
          (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
         (local_c8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_c8.data_ + 8))();
      }
    }
    else {
      dVar6 = *(double *)(pica::ParticleTypes::types + (long)local_78.typeIndex * 0x10);
      lVar4 = (long)*(short *)((long)&local_c0.message_.ptr_[-1].field_2 + 8) * 0x10;
      dVar7 = *(double *)(pica::ParticleTypes::types + lVar4);
      if (((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) ||
         ((((dVar8 = local_78.p.x * 29979245800.0 * dVar6,
            dVar9 = *(double *)&local_c0.message_.ptr_[-2].field_2 * 29979245800.0 * dVar7,
            dVar8 != dVar9 ||
            ((NAN(dVar8) || NAN(dVar9) ||
             (dVar8 = local_78.p.y * 29979245800.0 * dVar6,
             dVar9 = *(double *)((long)&local_c0.message_.ptr_[-2].field_2 + 8) * 29979245800.0 *
                     dVar7, dVar8 != dVar9)))) || (NAN(dVar8) || NAN(dVar9))) ||
          ((((dVar6 = local_78.p.z * 29979245800.0 * dVar6,
             dVar7 = (double)local_c0.message_.ptr_[-1]._M_dataplus._M_p * 29979245800.0 * dVar7,
             dVar6 != dVar7 || (NAN(dVar6) || NAN(dVar7))) ||
            (dVar6 = *(double *)(pica::ParticleTypes::types + 8 + (long)local_78.typeIndex * 0x10),
            pdVar1 = (double *)(pica::ParticleTypes::types + 8 + lVar4), dVar6 != *pdVar1)) ||
           (NAN(dVar6) || NAN(*pdVar1))))))) goto LAB_0019d2f0;
      dVar6 = (double)local_c0.message_.ptr_[-1]._M_string_length;
      local_d8.success_ = local_78.factor == dVar6;
      local_d8.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((local_78.factor != dVar6) || (NAN(local_78.factor) || NAN(dVar6))) goto LAB_0019d2fd;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d8.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pvVar2 = (void *)CONCAT71(local_c0._1_7_,local_c0.success_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,local_b0 - (long)pvVar2);
    }
    iVar5 = iVar5 + -1;
    if (iVar5 == 0) {
      if (local_a8.
          super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<pica::Particle<(pica::Dimension)2>,_std::allocator<pica::Particle<(pica::Dimension)2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

TYPED_TEST(ParticleArrayTest, Back)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    for (int i = 0; i < 13; i++) {
        ParticleType particle = this->randomParticle();
        particles.pushBack(particle);
        EXPECT_TRUE(this->eqParticles_(particle, particles.back()));
        const ParticleArray particlesCopy = particles;
        EXPECT_TRUE(this->eqParticles_(particle, particlesCopy.back()));
    }
}